

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::make_marginal<false>(data *sm,example *ec)

{
  float fVar1;
  bool bVar2;
  char *pcVar3;
  feature_value *pfVar4;
  ulong *puVar5;
  features_value_index_iterator *this;
  ostream *poVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  int __c;
  int __c_00;
  int __c_01;
  long in_RSI;
  iterator *rhs;
  features_value_iterator *pfVar10;
  long in_RDI;
  double dVar11;
  float weight;
  float marginal_pred;
  expert e;
  uint64_t key;
  uint64_t second_index;
  float second_value;
  uint64_t first_index;
  float first_value;
  iterator j;
  features *f;
  namespace_index n;
  iterator i;
  vw *all;
  float label;
  uint64_t mask;
  parameters *in_stack_fffffffffffffe78;
  example_predict *in_stack_fffffffffffffe80;
  pair<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_> *in_stack_fffffffffffffe88;
  features *in_stack_fffffffffffffe90;
  features *in_stack_fffffffffffffe98;
  features *in_stack_fffffffffffffed8;
  features *in_stack_fffffffffffffee0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false> local_c0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false> local_b8;
  long local_b0;
  ulong local_a8;
  float local_9c;
  features_value_iterator local_98 [2];
  ulong local_88;
  feature_value local_7c;
  features_value_iterator local_78 [2];
  features_value_index_iterator local_68;
  features *local_58;
  byte local_49;
  iterator local_48;
  iterator local_38;
  undefined8 local_28;
  undefined4 local_1c;
  uint64_t local_18;
  long local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = parameters::mask(in_stack_fffffffffffffe78);
  local_1c = *(undefined4 *)(local_10 + 0x6828);
  local_28 = *(undefined8 *)(local_8 + 0x6998);
  *(undefined4 *)(local_8 + 0x695c) = 0;
  *(undefined4 *)(local_8 + 0x6954) = 0;
  *(undefined4 *)(local_8 + 0x6958) = 0;
  *(undefined4 *)(local_8 + 0x6950) = 0;
  local_38 = example_predict::begin(in_stack_fffffffffffffe80);
  do {
    local_48 = example_predict::end(in_stack_fffffffffffffe80);
    rhs = &local_48;
    bVar2 = example_predict::iterator::operator!=(&local_38,rhs);
    if (!bVar2) {
      return;
    }
    pcVar3 = example_predict::iterator::index(&local_38,(char *)rhs,__c);
    local_49 = (byte)pcVar3;
    if ((*(byte *)(local_8 + 0xe + ((ulong)pcVar3 & 0xff)) & 1) != 0) {
      example_predict::iterator::operator*(&local_38);
      std::swap<features>(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_58 = example_predict::iterator::operator*(&local_38);
      features::clear((features *)in_stack_fffffffffffffe80);
      features::begin(in_stack_fffffffffffffe98);
      while( true ) {
        features::end(in_stack_fffffffffffffe98);
        pfVar10 = local_78;
        bVar2 = features_value_iterator::operator!=(&local_68.super_features_value_iterator,pfVar10)
        ;
        if (!bVar2) break;
        pfVar4 = features_value_iterator::value(&local_68.super_features_value_iterator);
        local_7c = *pfVar4;
        puVar5 = (ulong *)features_value_index_iterator::index(&local_68,(char *)pfVar10,__c_00);
        local_88 = *puVar5 & local_18;
        this = features_value_index_iterator::operator++
                         ((features_value_index_iterator *)in_stack_fffffffffffffe80);
        features::end(in_stack_fffffffffffffe98);
        pfVar10 = local_98;
        bVar2 = features_value_iterator::operator==(&this->super_features_value_iterator,pfVar10);
        if (bVar2) {
          poVar6 = std::operator<<((ostream *)&std::cout,"warning: id feature namespace has ");
          sVar8 = features::size((features *)0x3d15e9);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar8);
          poVar6 = std::operator<<(poVar6," features. Should be a multiple of 2");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          break;
        }
        pfVar4 = features_value_iterator::value(&local_68.super_features_value_iterator);
        local_9c = *pfVar4;
        puVar5 = (ulong *)features_value_index_iterator::index(&local_68,(char *)pfVar10,__c_01);
        local_a8 = *puVar5 & local_18;
        if ((((local_7c != 1.0) || (NAN(local_7c))) || (local_9c != 1.0)) || (NAN(local_9c))) {
          poVar6 = std::operator<<((ostream *)&std::cout,
                                   "warning: bad id features, must have value 1.");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        else {
          local_b0 = local_a8 + *(long *)(local_10 + 0x6820);
          local_b8._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
               ::find((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                       *)in_stack_fffffffffffffe78,(key_type *)0x3d16f1);
          local_c0._M_cur =
               (__node_type *)
               std::
               unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
               ::end((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                      *)in_stack_fffffffffffffe78);
          bVar2 = std::__detail::operator==(&local_b8,&local_c0);
          if (bVar2) {
            in_stack_fffffffffffffe98 = (features *)(local_8 + 0x6910);
            std::make_pair<float&,float&>((float *)in_stack_fffffffffffffe78,(float *)0x3d1755);
            std::make_pair<unsigned_long&,std::pair<float,float>>
                      ((unsigned_long *)in_stack_fffffffffffffe80,
                       (pair<float,_float> *)in_stack_fffffffffffffe78);
            std::
            unordered_map<unsigned_long,std::pair<double,double>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>>
            ::insert<std::pair<unsigned_long,std::pair<float,float>>>
                      ((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                        *)in_stack_fffffffffffffe90,
                       (pair<unsigned_long,_std::pair<float,_float>_> *)in_stack_fffffffffffffe88);
            if ((*(byte *)(local_8 + 0x6948) & 1) != 0) {
              in_stack_fffffffffffffe90 = (features *)(local_8 + 0x6960);
              std::make_pair<MARGINAL::expert&,MARGINAL::expert&>
                        ((expert *)in_stack_fffffffffffffe80,(expert *)in_stack_fffffffffffffe78);
              std::make_pair<unsigned_long&,std::pair<MARGINAL::expert,MARGINAL::expert>>
                        ((unsigned_long *)in_stack_fffffffffffffe80,
                         (pair<MARGINAL::expert,_MARGINAL::expert> *)in_stack_fffffffffffffe78);
              std::
              unordered_map<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>>
              ::insert<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                        ((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                          *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
            }
          }
          pmVar7 = std::
                   unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                   ::operator[]((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                                 *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
          in_stack_fffffffffffffe88 =
               (pair<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_> *)pmVar7->first;
          pmVar7 = std::
                   unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                   ::operator[]((unordered_map<unsigned_long,_std::pair<double,_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>_>
                                 *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78);
          dVar11 = (double)in_stack_fffffffffffffe88 / pmVar7->second;
          features::push_back(in_stack_fffffffffffffe90,
                              (feature_value)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                              (feature_index)in_stack_fffffffffffffe80);
          bVar2 = v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::empty((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)(local_8 + (ulong)local_49 * 0x68 + 0x150));
          if (!bVar2) {
            in_stack_fffffffffffffe80 = (example_predict *)&local_58->space_names;
            in_stack_fffffffffffffe78 = (parameters *)(local_8 + (ulong)local_49 * 0x68 + 0x150);
            sVar8 = features::size((features *)0x3d190b);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffe78,(sVar8 - 1) * 2);
            v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back((v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffffe80,
                        (shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffe78);
          }
          if ((*(byte *)(local_8 + 0x6948) & 1) != 0) {
            pmVar9 = std::
                     unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                     ::operator[]((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                                   *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78
                                 );
            fVar1 = (pmVar9->first).weight;
            *(float *)(local_8 + 0x6950) = fVar1 * (float)dVar11 + *(float *)(local_8 + 0x6950);
            *(float *)(local_8 + 0x6954) = fVar1 + *(float *)(local_8 + 0x6954);
            pmVar9 = std::
                     unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                     ::operator[]((unordered_map<unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>_>
                                   *)in_stack_fffffffffffffe80,(key_type *)in_stack_fffffffffffffe78
                                 );
            *(float *)(local_8 + 0x6958) = (pmVar9->second).weight + *(float *)(local_8 + 0x6958);
          }
        }
        features_value_index_iterator::operator++
                  ((features_value_index_iterator *)in_stack_fffffffffffffe80);
      }
    }
    example_predict::iterator::operator++(&local_38);
  } while( true );
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}